

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O0

UBool __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::operator==
          (LocalizedNumberFormatterAsFormat *this,Format *other)

{
  long local_d8;
  UnicodeString local_b0;
  UnicodeString local_70;
  UErrorCode local_2c;
  long lStack_28;
  UErrorCode localStatus;
  LocalizedNumberFormatterAsFormat *_other;
  Format *other_local;
  LocalizedNumberFormatterAsFormat *this_local;
  
  _other = (LocalizedNumberFormatterAsFormat *)other;
  other_local = &this->super_Format;
  if (other == (Format *)0x0) {
    local_d8 = 0;
  }
  else {
    local_d8 = __dynamic_cast(other,&Format::typeinfo,&typeinfo,0);
  }
  lStack_28 = local_d8;
  if (local_d8 == 0) {
    this_local._7_1_ = '\0';
  }
  else {
    local_2c = U_ZERO_ERROR;
    NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::toSkeleton
              (&local_70,
               &(this->fFormatter).
                super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>,&local_2c);
    NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::toSkeleton
              (&local_b0,
               (NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *)
               (lStack_28 + 0x148),&local_2c);
    this_local._7_1_ = UnicodeString::operator==(&local_70,&local_b0);
    UnicodeString::~UnicodeString(&local_b0);
    UnicodeString::~UnicodeString(&local_70);
  }
  return this_local._7_1_;
}

Assistant:

UBool LocalizedNumberFormatterAsFormat::operator==(const Format& other) const {
    auto* _other = dynamic_cast<const LocalizedNumberFormatterAsFormat*>(&other);
    if (_other == nullptr) {
        return false;
    }
    // TODO: Change this to use LocalizedNumberFormatter::operator== if it is ever proposed.
    // This implementation is fine, but not particularly efficient.
    UErrorCode localStatus = U_ZERO_ERROR;
    return fFormatter.toSkeleton(localStatus) == _other->fFormatter.toSkeleton(localStatus);
}